

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 float128_to_floatx80_mipsel(float128 a,float_status *status)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  floatx80 fVar4;
  int32_t aExp;
  undefined1 in_stack_00000008 [24];
  uint local_54;
  uint64_t local_50;
  ulong local_48;
  commonNaNT local_40;
  
  local_50 = a.low;
  local_48 = a.high & 0xffffffffffff;
  local_54 = a.high._6_2_ & 0x7fff;
  uVar3 = a.high._4_4_ >> 0x1f;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_50 != 0) {
      normalizeFloat128Subnormal(local_48,local_50,(int32_t *)&local_54,&local_48,&local_50);
      uVar2 = local_48;
      goto LAB_007c94a7;
    }
    uVar3 = uVar3 << 0xf;
    uVar1 = 0;
  }
  else {
    if (local_54 != 0x7fff) {
      uVar2 = local_48 + 0x1000000000000;
LAB_007c94a7:
      fVar4 = roundAndPackFloatx80_mipsel
                        ('P',a.high._7_1_ >> 7,local_54,uVar2 << 0xf | local_50 >> 0x31,
                         local_50 << 0xf,status);
      return fVar4;
    }
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_50 != 0) {
      float128ToCommonNaN(&local_40,a,status);
      fVar4 = commonNaNToFloatx80((commonNaNT)in_stack_00000008,
                                  (float_status *)(ulong)(uint)local_40._0_4_);
      return fVar4;
    }
    uVar3 = uVar3 << 0xf | 0x7fff;
    uVar1 = 0x8000000000000000;
  }
  fVar4._8_4_ = uVar3;
  fVar4.low = uVar1;
  fVar4._12_4_ = 0;
  return fVar4;
}

Assistant:

floatx80 float128_to_floatx80(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloatx80(float128ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    else {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shortShift128Left( aSig0, aSig1, 15, &aSig0, &aSig1 );
    return roundAndPackFloatx80(80, aSign, aExp, aSig0, aSig1, status);

}